

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_flow_entry(yaml_parser_t *parser)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  yaml_simple_key_t *pyVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  yaml_token_t *pyVar12;
  long lVar13;
  yaml_mark_t start_mark;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  
  pyVar3 = (parser->simple_keys).top;
  if ((pyVar3[-1].possible == 0) || (pyVar3[-1].required == 0)) {
    pyVar3[-1].possible = 0;
    parser->simple_key_allowed = 1;
    sVar4 = (parser->mark).column;
    sVar7 = (parser->mark).index;
    sVar8 = (parser->mark).line;
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    parser->unread = parser->unread - 1;
    pbVar5 = (parser->buffer).pointer;
    bVar2 = *pbVar5;
    lVar13 = 1;
    if ((char)bVar2 < '\0') {
      lVar13 = 2;
      if (((bVar2 & 0xe0) != 0xc0) && (lVar13 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar13 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
    }
    (parser->buffer).pointer = pbVar5 + lVar13;
    sVar6 = (parser->mark).column;
    sVar9 = (parser->mark).index;
    sVar10 = (parser->mark).line;
    uStack_5c = (undefined4)sVar4;
    uStack_58 = (undefined4)(sVar4 >> 0x20);
    uStack_68 = (undefined4)(sVar7 >> 0x20);
    uStack_64 = (undefined4)sVar8;
    uStack_60 = (undefined4)(sVar8 >> 0x20);
    tail = &(parser->tokens).tail;
    pyVar12 = (parser->tokens).tail;
    if (pyVar12 == (parser->tokens).end) {
      iVar11 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                 &(parser->tokens).end);
      if (iVar11 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        goto LAB_00107202;
      }
      pyVar12 = *tail;
    }
    *tail = pyVar12 + 1;
    pyVar12->type = YAML_FLOW_ENTRY_TOKEN;
    *(undefined8 *)&pyVar12->field_0x4 = 0;
    *(undefined8 *)((long)&(pyVar12->data).alias.value + 4) = 0;
    *(undefined8 *)((long)&(pyVar12->data).tag.suffix + 4) = 0;
    *(size_t *)((long)&pyVar12->data + 0x14) = sVar7 << 0x20;
    *(ulong *)((long)&(pyVar12->start_mark).index + 4) = CONCAT44(uStack_64,uStack_68);
    *(ulong *)((long)&(pyVar12->start_mark).line + 4) = CONCAT44(uStack_5c,uStack_60);
    *(undefined4 *)((long)&(pyVar12->start_mark).column + 4) = uStack_58;
    (pyVar12->end_mark).index = sVar9;
    (pyVar12->end_mark).line = sVar10;
    (pyVar12->end_mark).column = sVar6;
    iVar11 = 1;
  }
  else {
    sVar4 = pyVar3[-1].mark.column;
    sVar7 = pyVar3[-1].mark.index;
    sVar8 = pyVar3[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    (parser->context_mark).index = sVar7;
    (parser->context_mark).line = sVar8;
    (parser->context_mark).column = sVar4;
    parser->problem = "could not find expected \':\'";
    sVar4 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar4;
    (parser->problem_mark).column = (parser->mark).column;
LAB_00107202:
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int
yaml_parser_fetch_flow_entry(yaml_parser_t *parser)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset any potential simple keys on the current flow level. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* Simple keys are allowed after ','. */

    parser->simple_key_allowed = 1;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-ENTRY token and append it to the queue. */

    TOKEN_INIT(token, YAML_FLOW_ENTRY_TOKEN, start_mark, end_mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}